

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacReadVer.c
# Opt level: O0

int Psr_ManReadConstant(Psr_Man_t *p)

{
  char *pStr;
  int iVar1;
  char *pStart;
  Psr_Man_t *p_local;
  
  pStr = p->pCur;
  iVar1 = Psr_ManIsDigit(p);
  if (iVar1 == 0) {
    __assert_fail("Psr_ManIsDigit(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacReadVer.c"
                  ,0x149,"int Psr_ManReadConstant(Psr_Man_t *)");
  }
  while (iVar1 = Psr_ManIsDigit(p), iVar1 != 0) {
    p->pCur = p->pCur + 1;
  }
  iVar1 = Psr_ManIsChar(p,'\'');
  if (iVar1 == 0) {
    p_local._4_4_ = Psr_ManErrorSet(p,"Cannot read constant.",0);
  }
  else {
    p->pCur = p->pCur + 1;
    iVar1 = Psr_ManIsChar(p,'b');
    if (iVar1 == 0) {
      iVar1 = Psr_ManIsChar(p,'h');
      if (iVar1 == 0) {
        iVar1 = Psr_ManIsChar(p,'d');
        if (iVar1 == 0) {
          iVar1 = Psr_ManErrorSet(p,"Cannot read radix of constant.",0);
          return iVar1;
        }
        p->pCur = p->pCur + 1;
        p->pNtk->field_0x4 = p->pNtk->field_0x4 & 0xfb | 4;
        while (iVar1 = Psr_ManIsDigit(p), iVar1 != 0) {
          if (*p->pCur != '0') {
            p->pNtk->field_0x4 = p->pNtk->field_0x4 & 0xf7 | 8;
          }
          p->pCur = p->pCur + 1;
        }
      }
      else {
        p->pCur = p->pCur + 1;
        p->pNtk->field_0x4 = p->pNtk->field_0x4 & 0xfb | 4;
        while (iVar1 = Psr_CharIsDigitH(*p->pCur), iVar1 != 0) {
          if (*p->pCur != '0') {
            p->pNtk->field_0x4 = p->pNtk->field_0x4 & 0xf7 | 8;
          }
          p->pCur = p->pCur + 1;
        }
      }
    }
    else {
      p->pCur = p->pCur + 1;
      while (iVar1 = Psr_CharIsDigitB(*p->pCur), iVar1 != 0) {
        if (*p->pCur == '0') {
          p->pNtk->field_0x4 = p->pNtk->field_0x4 & 0xfb | 4;
        }
        else if (*p->pCur == '1') {
          p->pNtk->field_0x4 = p->pNtk->field_0x4 & 0xf7 | 8;
        }
        else if (*p->pCur == 'x') {
          p->pNtk->field_0x4 = p->pNtk->field_0x4 & 0xef | 0x10;
        }
        else if (*p->pCur == 'z') {
          p->pNtk->field_0x4 = p->pNtk->field_0x4 & 0xdf | 0x20;
        }
        p->pCur = p->pCur + 1;
      }
    }
    p_local._4_4_ = Abc_NamStrFindOrAddLim(p->pStrs,pStr,p->pCur,(int *)0x0);
  }
  return p_local._4_4_;
}

Assistant:

static inline int Psr_ManReadConstant( Psr_Man_t * p )
{
    char * pStart = p->pCur;
    assert( Psr_ManIsDigit(p) );
    while ( Psr_ManIsDigit(p) ) 
        p->pCur++;
    if ( !Psr_ManIsChar(p, '\'') )          return Psr_ManErrorSet(p, "Cannot read constant.", 0);
    p->pCur++;
    if ( Psr_ManIsChar(p, 'b') )
    {
        p->pCur++;
        while ( Psr_CharIsDigitB(*p->pCur) ) 
        {
            if ( *p->pCur == '0' )
                p->pNtk->fHasC0s = 1;
            else if ( *p->pCur == '1' )
                p->pNtk->fHasC1s = 1;
            else if ( *p->pCur == 'x' )
                p->pNtk->fHasCXs = 1;
            else if ( *p->pCur == 'z' )
                p->pNtk->fHasCZs = 1;
            p->pCur++;
        }
    }
    else if ( Psr_ManIsChar(p, 'h') )
    {
        p->pCur++;
        p->pNtk->fHasC0s = 1;
        while ( Psr_CharIsDigitH(*p->pCur) ) 
        {
            if ( *p->pCur != '0' )
                p->pNtk->fHasC1s = 1;
            p->pCur++;
        }
    }
    else if ( Psr_ManIsChar(p, 'd') )
    {
        p->pCur++;
        p->pNtk->fHasC0s = 1;
        while ( Psr_ManIsDigit(p) ) 
        {
            if ( *p->pCur != '0' )
                p->pNtk->fHasC1s = 1;
            p->pCur++;
        }
    }
    else                                    return Psr_ManErrorSet(p, "Cannot read radix of constant.", 0);
    return Abc_NamStrFindOrAddLim( p->pStrs, pStart, p->pCur, NULL );
}